

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_namespace::run_impl(statement_namespace *this)

{
  element_type *peVar1;
  domain_type *in_RDI;
  bool in_stack_0000003f;
  var *in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  domain_manager *in_stack_00000050;
  anon_class_8_1_8991fb9c *in_stack_00000078;
  domain_type *this_00;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5dcea4);
  peVar1 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5dceb0);
  this_00 = (domain_type *)&(peVar1->super_runtime_type).storage;
  run_impl::anon_class_8_1_8991fb9c::operator()(in_stack_00000078);
  make_shared_namespace<cs::name_space,cs::domain_type>(in_RDI);
  make_namespace((namespace_t *)in_RDI);
  domain_manager::add_var_no_return<std::__cxx11::string&>
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  cs_impl::any::~any((any *)0x5dcf3b);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x5dcf48);
  domain_type::~domain_type(this_00);
  return;
}

Assistant:

void statement_namespace::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		context->instance->storage.add_var_no_return(this->mName,
		make_namespace(make_shared_namespace<name_space>([this] {
			scope_guard scope(context);
			for (auto &ptr: mBlock)
			{
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(),
					                ptr->get_raw_code(), e.what());
				}
			}
			return scope.get();
		}())), true);
	}